

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
FlushDictionary(StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                *this,PrimitiveColumnWriterState *state_p,ColumnWriterStatistics *stats)

{
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *pSVar1;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *in_RDI;
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *state;
  idx_t in_stack_000001e8;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
  *in_stack_000001f0;
  PrimitiveColumnWriterState *in_stack_000001f8;
  PrimitiveColumnWriter *in_stack_00000200;
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
  *in_stack_ffffffffffffff48;
  ColumnWriterState *in_stack_ffffffffffffff50;
  function<void_(const_duckdb::string_t_&,_const_duckdb::string_t_&)> *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffff78;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *this_00;
  
  pSVar1 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>>
                     (in_stack_ffffffffffffff50);
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::GetSize
            (&pSVar1->dictionary);
  ParquetWriter::BloomFilterFalsePositiveRatio((ParquetWriter *)in_RDI->maximum_size);
  make_uniq<duckdb::ParquetBloomFilter,unsigned_long,double>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
  operator=((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
             *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
               *)0x5b85dc);
  this_00 = (PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
             *)&stack0xffffffffffffffe8;
  std::function<void(duckdb::string_t_const&,duckdb::string_t_const&)>::
  function<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>::FlushDictionary(duckdb::PrimitiveColumnWriterState&,duckdb::ColumnWriterStatistics*)::_lambda(duckdb::string_t_const&,duckdb::string_t_const&)_1_,void>
            ((function<void_(const_duckdb::string_t_&,_const_duckdb::string_t_&)> *)in_RDI,
             (anon_class_16_2_bbc851bb *)in_stack_ffffffffffffff58);
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
  IterateValues<duckdb::string_t,_0>(in_RDI,in_stack_ffffffffffffff58);
  std::function<void_(const_duckdb::string_t_&,_const_duckdb::string_t_&)>::~function
            ((function<void_(const_duckdb::string_t_&,_const_duckdb::string_t_&)> *)0x5b8638);
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
  GetTargetMemoryStream(this_00);
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::GetSize
            (&pSVar1->dictionary);
  PrimitiveColumnWriter::WriteDictionary
            (in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             0x5b8692);
  return;
}

Assistant:

void FlushDictionary(PrimitiveColumnWriterState &state_p, ColumnWriterStatistics *stats) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		D_ASSERT(state.encoding == duckdb_parquet::Encoding::RLE_DICTIONARY);

		state.bloom_filter =
		    make_uniq<ParquetBloomFilter>(state.dictionary.GetSize(), writer.BloomFilterFalsePositiveRatio());

		state.dictionary.IterateValues([&](const SRC &src_value, const TGT &tgt_value) {
			// update the statistics
			OP::template HandleStats<SRC, TGT>(stats, tgt_value);
			// update the bloom filter
			auto hash = OP::template XXHash64<SRC, TGT>(tgt_value);
			state.bloom_filter->FilterInsert(hash);
		});

		// flush the dictionary page and add it to the to-be-written pages
		WriteDictionary(state, state.dictionary.GetTargetMemoryStream(), state.dictionary.GetSize());
		// bloom filter will be queued for writing in ParquetWriter::BufferBloomFilter one level up
	}